

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_string_codePointAt(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue v;
  JSValue v_00;
  JSValue JVar1;
  int iVar2;
  JSValue JVar3;
  int c;
  int idx;
  JSString *p;
  JSValue ret;
  JSValue val;
  JSContext *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int64_t in_stack_ffffffffffffff60;
  JSValueUnion p_00;
  JSValue JVar4;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  int local_78;
  undefined4 uStack_74;
  int64_t local_70;
  int local_30;
  undefined4 uStack_2c;
  int64_t local_28;
  undefined4 uStack_c;
  
  JVar4.u._4_4_ = in_stack_ffffffffffffff5c;
  JVar4.u.int32 = in_stack_ffffffffffffff58;
  JVar4.tag = in_stack_ffffffffffffff60;
  JVar3 = JS_ToStringCheckObject(in_stack_ffffffffffffff50,JVar4);
  p_00 = JVar3.u;
  local_28 = JVar3.tag;
  JVar4 = JVar3;
  iVar2 = JS_IsException(JVar3);
  if (iVar2 == 0) {
    JVar3.u._4_4_ = in_stack_ffffffffffffff7c;
    JVar3.u.int32 = in_stack_ffffffffffffff78;
    JVar3.tag = (int64_t)p_00.ptr;
    iVar2 = JS_ToInt32Sat((JSContext *)JVar4.tag,(int *)JVar4.u.ptr,JVar3);
    if (iVar2 == 0) {
      if ((in_stack_ffffffffffffff7c < 0) ||
         ((int)((uint)*(undefined8 *)((long)p_00.ptr + 4) & 0x7fffffff) <= in_stack_ffffffffffffff7c
         )) {
        in_stack_ffffffffffffff58 = 0;
        in_stack_ffffffffffffff60 = 3;
        local_78 = 0;
        local_70 = 3;
        uStack_74 = in_stack_ffffffffffffff5c;
      }
      else {
        local_78 = string_getc((JSString *)p_00.ptr,(int *)&stack0xffffffffffffff7c);
        uStack_74 = uStack_c;
        in_stack_ffffffffffffff50 = (JSContext *)0x0;
        local_70 = 0;
      }
      v_00.u._4_4_ = in_stack_ffffffffffffff5c;
      v_00.u.int32 = in_stack_ffffffffffffff58;
      v_00.tag = in_stack_ffffffffffffff60;
      JS_FreeValue(in_stack_ffffffffffffff50,v_00);
      local_30 = local_78;
      uStack_2c = uStack_74;
      local_28 = local_70;
    }
    else {
      v.u._4_4_ = in_stack_ffffffffffffff5c;
      v.u.int32 = in_stack_ffffffffffffff58;
      v.tag = in_stack_ffffffffffffff60;
      JS_FreeValue(in_stack_ffffffffffffff50,v);
      local_30 = 0;
      local_28 = 6;
    }
  }
  else {
    local_30 = JVar3.u._0_4_;
    uStack_2c = JVar3.u._4_4_;
  }
  JVar1.u._4_4_ = uStack_2c;
  JVar1.u.int32 = local_30;
  JVar1.tag = local_28;
  return JVar1;
}

Assistant:

static JSValue js_string_codePointAt(JSContext *ctx, JSValueConst this_val,
                                     int argc, JSValueConst *argv)
{
    JSValue val, ret;
    JSString *p;
    int idx, c;

    val = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(val))
        return val;
    p = JS_VALUE_GET_STRING(val);
    if (JS_ToInt32Sat(ctx, &idx, argv[0])) {
        JS_FreeValue(ctx, val);
        return JS_EXCEPTION;
    }
    if (idx < 0 || idx >= p->len) {
        ret = JS_UNDEFINED;
    } else {
        c = string_getc(p, &idx);
        ret = JS_NewInt32(ctx, c);
    }
    JS_FreeValue(ctx, val);
    return ret;
}